

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerStPropIdArrFromVar(Lowerer *this,Instr *stPropIdInstr)

{
  HelperCallOpnd *newSrc;
  Opnd *newSrc_00;
  Instr *pIVar1;
  
  newSrc = IR::HelperCallOpnd::New(HelperStPropIdArrFromVar,this->m_func);
  newSrc_00 = IR::Instr::UnlinkSrc1(stPropIdInstr);
  IR::Instr::SetSrc1(stPropIdInstr,&newSrc->super_Opnd);
  IR::Instr::SetSrc2(stPropIdInstr,newSrc_00);
  pIVar1 = LowererMD::LowerCallHelper(&this->m_lowererMD,stPropIdInstr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerStPropIdArrFromVar(IR::Instr * stPropIdInstr)
{
    IR::HelperCallOpnd *helperOpnd = IR::HelperCallOpnd::New(IR::HelperStPropIdArrFromVar, this->m_func);

    IR::Opnd * src1 = stPropIdInstr->UnlinkSrc1();
    stPropIdInstr->SetSrc1(helperOpnd);
    stPropIdInstr->SetSrc2(src1);

    return m_lowererMD.LowerCallHelper(stPropIdInstr);
}